

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O1

void fy_diag_cfg_default(fy_diag_cfg *cfg)

{
  int iVar1;
  
  if (cfg != (fy_diag_cfg *)0x0) {
    *(undefined8 *)&cfg->field_0x20 = 0;
    cfg->position_width = 0;
    cfg->type_width = 0;
    cfg->user = (void *)0x0;
    cfg->level = FYET_DEBUG;
    cfg->module_mask = 0;
    cfg->fp = (FILE *)0x0;
    cfg->output_fn = (fy_diag_output_fn)0x0;
    *(undefined8 *)&cfg->module_width = 0;
    cfg->fp = (FILE *)_stderr;
    cfg->level = FYET_INFO;
    cfg->module_mask = 0xff;
    cfg->field_0x20 = cfg->field_0x20 & 0xe0 | 8;
    iVar1 = fileno(_stderr);
    iVar1 = isatty(iVar1);
    cfg->field_0x20 = cfg->field_0x20 & 0xfe | iVar1 == 1;
    cfg->source_width = 0x32;
    cfg->position_width = 10;
    cfg->type_width = 5;
    cfg->module_width = 6;
  }
  return;
}

Assistant:

void fy_diag_cfg_default(struct fy_diag_cfg *cfg) {
    if (!cfg)
        return;

    memset(cfg, 0, sizeof(*cfg));

    cfg->fp = stderr;
    fy_diag_cfg_from_parser_flags(cfg, FYPCF_DEFAULT_PARSE);
    cfg->colorize = isatty(fileno(stderr)) == 1;
    fy_diag_cfg_default_widths(cfg);
}